

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O1

void __thiscall
glcts::anon_unknown_0::ShortByteData<tcu::Vector<int,_4>_>::ShortByteData
          (ShortByteData<tcu::Vector<int,_4>_> *this,int size,Vector<int,_4> *value,
          GLenum internalformat,GLenum format)

{
  int iVar1;
  pointer pVVar2;
  pointer psVar3;
  int iVar4;
  char cVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  allocator_type local_2b;
  allocator_type local_2a;
  allocator_type local_29;
  
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (&this->data,(ulong)(uint)(size * size),value,&local_29);
  uVar6 = (ulong)(uint)(size * size * 4);
  std::vector<short,_std::allocator<short>_>::vector(&this->datas,uVar6,&local_2a);
  std::vector<signed_char,_std::allocator<signed_char>_>::vector(&this->datab,uVar6,&local_2b);
  if ((format == 0x8d94) || (format == 0x1903)) {
    pVVar2 = (this->data).
             super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (long)(this->data).
                  super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 4;
    if (3 < uVar6) {
      uVar8 = 1;
      uVar9 = 0;
      do {
        pVVar2->m_data[uVar9] = pVVar2[uVar9 & 0xffffffff].m_data[0];
        iVar4 = (int)uVar9;
        pVVar2->m_data[uVar9 + 1] = pVVar2[iVar4 + 1].m_data[0];
        pVVar2->m_data[uVar9 + 2] = pVVar2[iVar4 + 2].m_data[0];
        pVVar2->m_data[uVar9 + 3] = pVVar2[iVar4 + 3].m_data[0];
        uVar11 = (ulong)uVar8;
        uVar9 = uVar9 + 4;
        uVar8 = uVar8 + 1;
      } while (uVar11 < uVar6 >> 2);
    }
  }
  if ((int)internalformat < 0x8d88) {
    if (internalformat == 0x8058) goto LAB_00c53534;
    if (internalformat == 0x8d76) goto LAB_00c534b9;
  }
  else {
    if ((internalformat == 0x8f97) || (internalformat == 0x8d8e)) goto LAB_00c53534;
    if (internalformat != 0x8d88) {
      return;
    }
LAB_00c534b9:
    psVar3 = (this->datas).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)(this->datas).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)psVar3;
    if (lVar7 != 0) {
      pVVar2 = (this->data).
               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar10 = 3;
      do {
        psVar3[lVar10 + -3] = *(short *)(pVVar2->m_data + lVar10 + 0xfffffffffffffffd);
        psVar3[lVar10 + -2] = *(short *)(pVVar2->m_data + lVar10 + 0xfffffffffffffffe);
        psVar3[lVar10 + -1] = *(short *)(pVVar2->m_data + lVar10 + 0xffffffffffffffff);
        psVar3[lVar10] = (short)pVVar2->m_data[lVar10];
        iVar4 = (int)lVar10;
        lVar10 = lVar10 + 4;
      } while ((ulong)(iVar4 + 1) < (ulong)(lVar7 >> 1));
    }
    if (0x8d8d < (int)internalformat) {
      if ((internalformat != 0x8f97) && (internalformat != 0x8d8e)) {
        return;
      }
      goto LAB_00c53534;
    }
    if (internalformat == 0x8058) goto LAB_00c53534;
  }
  if (internalformat != 0x8d7c) {
    return;
  }
LAB_00c53534:
  if ((this->datas).super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->datas).super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      iVar4 = (int)uVar6;
      if ((internalformat == 0x8d8e) || (internalformat == 0x8d7c)) {
        uVar9 = uVar6 >> 2;
        (this->datab).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] =
             (char)(this->data).
                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar9].m_data[0];
        (this->datab).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start[iVar4 + 1] =
             (char)(this->data).
                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar9].m_data[1];
        (this->datab).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start[iVar4 + 2] =
             (char)(this->data).
                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar9].m_data[2];
        cVar5 = (char)(this->data).
                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar9].m_data[3];
      }
      else {
        uVar9 = uVar6 >> 2;
        iVar1 = (this->data).
                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar9].m_data[0];
        (this->datab).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] = (char)(iVar1 << 7) - (char)iVar1;
        iVar1 = (this->data).
                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar9].m_data[1];
        (this->datab).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start[iVar4 + 1] = (char)(iVar1 << 7) - (char)iVar1;
        iVar1 = (this->data).
                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar9].m_data[2];
        (this->datab).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start[iVar4 + 2] = (char)(iVar1 << 7) - (char)iVar1;
        iVar1 = (this->data).
                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar9].m_data[3];
        cVar5 = (char)(iVar1 << 7) - (char)iVar1;
      }
      (this->datab).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start[iVar4 + 3] = cVar5;
      uVar6 = (ulong)(iVar4 + 4);
    } while (uVar6 < (ulong)((long)(this->datas).super__Vector_base<short,_std::allocator<short>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->datas).super__Vector_base<short,_std::allocator<short>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 1));
  }
  return;
}

Assistant:

ShortByteData(int size, const T& value, GLenum internalformat, GLenum format)
		: data(size * size, value), datas(size * size * 4), datab(size * size * 4)
	{
		if (Components(format) == 1)
			for (unsigned i = 0; i < data.size() / 4; ++i)
			{
				data[i][0] = data[i * 4][0];
				data[i][1] = data[i * 4 + 1][0];
				data[i][2] = data[i * 4 + 2][0];
				data[i][3] = data[i * 4 + 3][0];
			}
		if (Shorts(internalformat))
		{
			for (unsigned i = 0; i < datas.size(); i += 4)
			{
				datas[i]	 = static_cast<GLshort>(data[i / 4][0]);
				datas[i + 1] = static_cast<GLshort>(data[i / 4][1]);
				datas[i + 2] = static_cast<GLshort>(data[i / 4][2]);
				datas[i + 3] = static_cast<GLshort>(data[i / 4][3]);
			}
		}
		if (Bytes(internalformat))
		{
			for (unsigned i = 0; i < datas.size(); i += 4)
			{
				if (internalformat == GL_RGBA8I || internalformat == GL_RGBA8UI)
				{
					datab[i]	 = static_cast<GLbyte>(data[i / 4][0]);
					datab[i + 1] = static_cast<GLbyte>(data[i / 4][1]);
					datab[i + 2] = static_cast<GLbyte>(data[i / 4][2]);
					datab[i + 3] = static_cast<GLbyte>(data[i / 4][3]);
				}
				else if (internalformat == GL_RGBA8)
				{
					datab[i]	 = static_cast<GLbyte>(data[i / 4][0] * 255);
					datab[i + 1] = static_cast<GLbyte>(data[i / 4][1] * 255);
					datab[i + 2] = static_cast<GLbyte>(data[i / 4][2] * 255);
					datab[i + 3] = static_cast<GLbyte>(data[i / 4][3] * 255);
				}
				else
				{ // GL_RGBA8_SNORM
					datab[i]	 = static_cast<GLbyte>(data[i / 4][0] * 127);
					datab[i + 1] = static_cast<GLbyte>(data[i / 4][1] * 127);
					datab[i + 2] = static_cast<GLbyte>(data[i / 4][2] * 127);
					datab[i + 3] = static_cast<GLbyte>(data[i / 4][3] * 127);
				}
			}
		}
	}